

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O3

bool __thiscall flatbuffers::GoGRPCGenerator::generate(GoGRPCGenerator *this)

{
  Parser *pPVar1;
  ServiceDef *pSVar2;
  Namespace *this_00;
  bool bVar3;
  File *file_00;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  Namespace *ns;
  Parameters *parameters;
  long lVar7;
  string filename;
  string output;
  FlatBufFile file;
  Parameters p;
  string local_138;
  string local_118;
  GoGRPCGenerator *local_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  undefined **local_b0;
  Parser *local_a8;
  string *local_a0;
  undefined4 local_98;
  CommentHolder local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pPVar1 = this->parser_;
  local_a0 = this->file_name_;
  local_b0 = &PTR__CommentHolder_003ea388;
  local_98 = 0;
  local_90._vptr_CommentHolder = (_func_int **)&local_80;
  local_88 = 0;
  local_80 = 0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  parameters = (Parameters *)0x13;
  local_f8 = this;
  local_a8 = pPVar1;
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x371d40);
  if ((int)((ulong)((long)(pPVar1->services_).vec.
                          super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pPVar1->services_).vec.
                         super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    bVar3 = true;
  }
  else {
    lVar7 = 0;
    do {
      file_00 = (File *)operator_new(0x10);
      pSVar2 = (pPVar1->services_).vec.
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7];
      (file_00->super_CommentHolder)._vptr_CommentHolder =
           (_func_int **)&PTR__CommentHolder_003ea210;
      file_00[1].super_CommentHolder._vptr_CommentHolder = (_func_int **)pSVar2;
      pSVar2 = (local_f8->parser_->services_).vec.
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7];
      BaseGenerator::LastNamespacePart_abi_cxx11_
                (&local_118,(BaseGenerator *)(pSVar2->super_Definition).defined_namespace,ns);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pSVar2->super_Definition).defined_namespace;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
      Namespace::GetFullyQualifiedName(&local_118,this_00,&local_138,1000);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      grpc_go_generator::GenerateServiceSource_abi_cxx11_
                (&local_118,(grpc_go_generator *)&local_b0,file_00,(Service *)&local_90,parameters);
      BaseGenerator::NamespaceDir_abi_cxx11_
                (&local_d0,&local_f8->super_BaseGenerator,
                 (pSVar2->super_Definition).defined_namespace,false);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,
                                  *(ulong *)&(pSVar2->super_Definition).name._M_dataplus);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar4[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
        local_f0 = (long *)*plVar4;
      }
      local_e8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_138.field_2._M_allocated_capacity = *psVar6;
        local_138.field_2._8_8_ = plVar4[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar6;
        local_138._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_138._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar3 = SaveFile(local_138._M_dataplus._M_p,local_118._M_dataplus._M_p,
                       local_118._M_string_length,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      (*(file_00->super_CommentHolder)._vptr_CommentHolder[1])(file_00);
    } while ((bVar3) &&
            (lVar7 = lVar7 + 1, pPVar1 = local_a8,
            lVar7 < (int)((ulong)((long)(local_a8->services_).vec.
                                        super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_a8->services_).vec.
                                       super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3)));
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_90._vptr_CommentHolder != (_func_int **)&local_80) {
    operator_delete(local_90._vptr_CommentHolder,CONCAT71(uStack_7f,local_80) + 1);
  }
  return bVar3;
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageGo);
    grpc_go_generator::Parameters p;
    p.custom_method_io_type = "flatbuffers.Builder";
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name = LastNamespacePart(*(def->defined_namespace));
      p.service_prefix =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_go_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "_grpc.go";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }